

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv2dTest.c
# Opt level: O1

void main(void)

{
  byte bVar1;
  int iVar2;
  long M;
  long lVar3;
  float *data;
  ulong uVar4;
  size_t sVar5;
  char *__s;
  long lVar6;
  long lVar7;
  long lVar8;
  long kernSize2;
  long dataSize;
  long kernSize;
  long dataSize2;
  FILE *local_90;
  float *local_88;
  long local_78;
  long local_70;
  long local_68;
  size_t local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_68 = 0x35;
  local_78 = 0x1d;
  local_70 = 0xcc;
  local_38 = 0x24;
  printf(" %zu  Byte Floats \n",4);
  printf(" randseed = %10u\n",0x309);
  srand(0x309);
  M = lround(8.0);
  bVar1 = (byte)M;
  lVar6 = 1L << (bVar1 & 0x3f);
  lVar3 = lround(5.999999999999999);
  lVar8 = 1L << ((byte)lVar3 & 0x3f);
  printf("fft size = %6ld X%6ld,  ",lVar8,lVar6);
  iVar2 = fft2dInit(lVar3,M);
  sVar5 = lVar8 << (bVar1 & 0x3f);
  data = (float *)calloc(sVar5,4);
  uVar4 = 2;
  if (data != (float *)0x0) {
    uVar4 = (long)iVar2;
  }
  if (uVar4 == 0) {
    local_88 = (float *)calloc(sVar5,4);
    uVar4 = (ulong)((uint)(local_88 == (float *)0x0) * 2);
  }
  if (uVar4 == 0) {
    local_90 = fopen("conv2ddat.c2d","wb");
    uVar4 = 0xffffffffffffffce;
    if (local_90 != (FILE *)0x0) {
      uVar4 = 0;
    }
  }
  if (uVar4 == 2) {
    __s = " out of memory ";
  }
  else {
    if (uVar4 == 0) {
      local_60 = sVar5;
      local_58 = lVar3;
      local_50 = lVar6;
      local_48 = lVar8;
      fwrite(&local_70,8,1,local_90);
      fwrite(&local_38,8,1,local_90);
      fwrite(&local_68,8,1,local_90);
      fwrite(&local_78,8,1,local_90);
      lVar3 = local_70;
      local_40 = local_38;
      if (0 < local_38) {
        sVar5 = local_70 * 4;
        lVar6 = 0;
        do {
          if (0 < lVar3) {
            lVar8 = 0;
            do {
              iVar2 = rand();
              data[(lVar6 << (bVar1 & 0x3f)) + lVar8] = (float)iVar2 * 9.313226e-10 + -1.0;
              lVar8 = lVar8 + 1;
            } while (lVar3 != lVar8);
          }
          fwrite(data + (lVar6 << (bVar1 & 0x3f)),sVar5,1,local_90);
          lVar6 = lVar6 + 1;
        } while (lVar6 != local_40);
      }
      lVar3 = local_58;
      if (0 < local_78) {
        lVar6 = 0;
        do {
          lVar8 = local_68;
          if (0 < local_68) {
            lVar7 = 0;
            do {
              iVar2 = rand();
              local_88[(lVar6 << (bVar1 & 0x3f)) + lVar7] = (float)iVar2 * 9.313226e-10 + -1.0;
              lVar7 = lVar7 + 1;
            } while (lVar8 != lVar7);
          }
          fwrite(local_88 + (lVar6 << (bVar1 & 0x3f)),lVar8 << 2,1,local_90);
          lVar6 = lVar6 + 1;
        } while (lVar6 < local_78);
      }
      rfft2d(data,lVar3,M);
      rfft2d(local_88,lVar3,M);
      rspect2dprod(data,local_88,data,local_48,local_50);
      rifft2d(data,lVar3,M);
      fwrite(data,local_60 << 2,1,local_90);
      fclose(local_90);
      free(local_88);
      free(data);
      goto LAB_00101577;
    }
    __s = " error ";
  }
  puts(__s);
LAB_00101577:
  fft2dFree();
  puts(" Done. ");
  return;
}

Assistant:

void main(){
long 	N = 256;	/* the number of cols in 2d ffts, must be power of 2 */
long 	N2 = 64;	/* the number of rows in 2d ffts, must be power of 2 */
long 	kernSize = 53;	/* kernal cols must be less than N */
long 	kernSize2 = 29;	/* kernal rows must be less than N2*/
long 	dataSize = N-kernSize+1;	/* data cols */
long 	dataSize2 = N2-kernSize2+1;	/* data rows */
float	*a;
float	*b;
long 	i1;
long 	i2;
long 	TheErr;
long		M;
long		M2;

FILE *fdataout;				/* output file */

unsigned int	randseed = 777;
int		rannum;
#if macintosh
	UnsignedWide 		TheTime1;
	Microseconds(&TheTime1);
	randseed = TheTime1.lo;
#endif

printf(" %zu  Byte Floats \n", sizeof(a[0]));
printf(" randseed = %10u\n", randseed);

srand(randseed);
M = lround(LOG2(N));
N = POW2(M);
M2 = lround(LOG2(N2));
N2 = POW2(M2);

printf("fft size = %6ld X%6ld,  ", N2, N);

if ((dataSize <= 0)||(dataSize2 <= 0)) TheErr = 22;
else TheErr = 0;

if(!TheErr){
	TheErr = fft2dInit(M2, M);
}

a = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N to N2
if (a == 0) TheErr = 2;
if(!TheErr){
	b = (float *) calloc(N2*N,sizeof(float) );	// calloc to zero pad data to fill N to N2
	if (b == 0) TheErr = 2;
}
if(!TheErr){
	fdataout = fopen("conv2ddat.c2d", "wb");
	if (fdataout == NULL) TheErr = -50;
}
if(!TheErr){

		/*  write sizes to fdataout */
	fwrite(&dataSize, sizeof(dataSize), 1, fdataout);
	fwrite(&dataSize2, sizeof(dataSize2), 1, fdataout);
	fwrite(&kernSize, sizeof(kernSize), 1, fdataout);
	fwrite(&kernSize2, sizeof(kernSize2), 1, fdataout);
		/*  set up a simple test case and write to fdataout */
	for (i2=0; i2<dataSize2; i2++){
		for (i1=0; i1<dataSize; i1++){
			rannum = rand();
			a[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&a[i2*N], dataSize*sizeof(float), 1, fdataout);
	}
	for (i2=0; i2<kernSize2; i2++){
		for (i1=0; i1<kernSize; i1++){
			rannum = rand();
			b[i2*N+i1] = BIPRAND(rannum);
		}
		fwrite(&b[i2*N], kernSize*sizeof(float), 1, fdataout);
	}

	/* fast 2d convolution of zero padded sequences */
	rfft2d(a, M2, M);
	rfft2d(b, M2, M);
	rspect2dprod(a, b, a, N2, N);
	rifft2d(a, M2, M);

	/* write out answer */
	fwrite(a, N2*N*sizeof(float), 1, fdataout);

	fclose(fdataout);

	free(b);
	free(a);
	fft2dFree();
}
else{
	if(TheErr==2)	printf(" out of memory \n");
	else	printf(" error \n");
	fft2dFree();
}
printf(" Done. \n");
return;
}